

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<4,_10,_10>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  undefined8 *puVar1;
  float *pfVar2;
  undefined1 *puVar3;
  long lVar4;
  undefined4 *puVar5;
  undefined8 *puVar6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  bool bVar13;
  undefined4 uVar14;
  Type in1;
  Type in0;
  float afStack_f8 [6];
  float local_e0 [2];
  ulong local_d8;
  undefined4 local_d0;
  undefined8 local_c8;
  float local_c0;
  undefined8 local_b8;
  undefined4 local_b0;
  undefined8 local_a8;
  undefined4 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 local_88 [4];
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long lVar12;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    puVar1 = &local_28;
    lVar4 = 0;
    lVar7 = 0;
    do {
      lVar8 = 0;
      auVar9 = _DAT_00a99400;
      do {
        bVar13 = SUB164(auVar9 ^ _DAT_00a99450,4) == -0x80000000 &&
                 SUB164(auVar9 ^ _DAT_00a99450,0) < -0x7ffffffd;
        if (bVar13) {
          uVar14 = 0x3f800000;
          if (lVar4 != lVar8) {
            uVar14 = 0;
          }
          *(undefined4 *)((long)puVar1 + lVar8 + -0x10) = uVar14;
        }
        if (bVar13) {
          uVar14 = 0x3f800000;
          if (lVar4 + -0x10 != lVar8) {
            uVar14 = 0;
          }
          *(undefined4 *)((long)puVar1 + lVar8) = uVar14;
        }
        lVar12 = auVar9._8_8_;
        auVar9._0_8_ = auVar9._0_8_ + 2;
        auVar9._8_8_ = lVar12 + 2;
        lVar8 = lVar8 + 0x20;
      } while (lVar8 != 0x40);
      lVar7 = lVar7 + 1;
      lVar4 = lVar4 + 0x10;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
    } while (lVar7 != 4);
    local_38 = *(undefined8 *)evalCtx->in[0].m_data;
    uStack_30 = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_28 = *(undefined8 *)evalCtx->in[1].m_data;
    uStack_20 = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_18 = *(undefined8 *)evalCtx->in[2].m_data;
    uStack_10 = *(undefined8 *)(evalCtx->in[2].m_data + 2);
  }
  else {
    puVar1 = &local_38;
    local_18 = 0;
    uStack_10 = 0;
    local_28 = 0;
    uStack_20 = 0;
    local_38 = 0;
    uStack_30 = 0;
    puVar5 = &sr::(anonymous_namespace)::s_constInMat3x4;
    lVar4 = 0;
    do {
      lVar7 = 0;
      do {
        *(undefined4 *)((long)puVar1 + lVar7 * 4) = *(undefined4 *)((long)puVar5 + lVar7);
        lVar7 = lVar7 + 4;
      } while (lVar7 != 0xc);
      lVar4 = lVar4 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      puVar5 = puVar5 + 3;
    } while (lVar4 != 4);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    puVar1 = &local_58;
    lVar4 = 0;
    lVar7 = 0;
    do {
      lVar8 = 0;
      auVar10 = _DAT_00a99400;
      do {
        bVar13 = SUB164(auVar10 ^ _DAT_00a99450,4) == -0x80000000 &&
                 SUB164(auVar10 ^ _DAT_00a99450,0) < -0x7ffffffd;
        if (bVar13) {
          uVar14 = 0x3f800000;
          if (lVar4 != lVar8) {
            uVar14 = 0;
          }
          *(undefined4 *)((long)puVar1 + lVar8 + -0x10) = uVar14;
        }
        if (bVar13) {
          uVar14 = 0x3f800000;
          if (lVar4 + -0x10 != lVar8) {
            uVar14 = 0;
          }
          *(undefined4 *)((long)puVar1 + lVar8) = uVar14;
        }
        lVar12 = auVar10._8_8_;
        auVar10._0_8_ = auVar10._0_8_ + 2;
        auVar10._8_8_ = lVar12 + 2;
        lVar8 = lVar8 + 0x20;
      } while (lVar8 != 0x40);
      lVar7 = lVar7 + 1;
      lVar4 = lVar4 + 0x10;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
    } while (lVar7 != 4);
    res.m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    stack0xffffffffffffffa0 = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_58 = *(undefined8 *)evalCtx->in[1].m_data;
    uStack_50 = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_48 = *(undefined8 *)evalCtx->in[2].m_data;
    uStack_40 = *(undefined8 *)(evalCtx->in[2].m_data + 2);
  }
  else {
    pfVar2 = res.m_data;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    res.m_data[0] = 0.0;
    res.m_data[1] = 0.0;
    stack0xffffffffffffffa0 = 0;
    puVar5 = &DAT_00af0af0;
    lVar4 = 0;
    do {
      lVar7 = 0;
      do {
        pfVar2[lVar7] = (float)*(undefined4 *)((long)puVar5 + lVar7);
        lVar7 = lVar7 + 4;
      } while (lVar7 != 0xc);
      lVar4 = lVar4 + 1;
      pfVar2 = pfVar2 + 1;
      puVar5 = puVar5 + 3;
    } while (lVar4 != 4);
  }
  puVar3 = local_88;
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  stack0xffffffffffffff90 = 0;
  uStack_84 = 0;
  uStack_80 = 0;
  uStack_7c = 0;
  local_98 = 0;
  uStack_90 = 0;
  lVar4 = 0;
  lVar7 = 0;
  do {
    lVar8 = 0;
    auVar11 = _DAT_00a99400;
    do {
      bVar13 = SUB164(auVar11 ^ _DAT_00a99450,4) == -0x80000000 &&
               SUB164(auVar11 ^ _DAT_00a99450,0) < -0x7ffffffd;
      if (bVar13) {
        uVar14 = 0x3f800000;
        if (lVar4 != lVar8) {
          uVar14 = 0;
        }
        *(undefined4 *)(puVar3 + lVar8 + -0x10) = uVar14;
      }
      if (bVar13) {
        uVar14 = 0x3f800000;
        if (lVar4 + -0x10 != lVar8) {
          uVar14 = 0;
        }
        *(undefined4 *)(puVar3 + lVar8) = uVar14;
      }
      lVar12 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 2;
      auVar11._8_8_ = lVar12 + 2;
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0x40);
    lVar7 = lVar7 + 1;
    lVar4 = lVar4 + 0x10;
    puVar3 = puVar3 + 4;
  } while (lVar7 != 4);
  puVar1 = &local_98;
  pfVar2 = res.m_data;
  puVar6 = &local_38;
  lVar4 = 0;
  do {
    lVar7 = 0;
    do {
      *(float *)((long)puVar1 + lVar7) =
           *(float *)((long)puVar6 + lVar7) * *(float *)((long)pfVar2 + lVar7);
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x30);
    lVar4 = lVar4 + 1;
    puVar1 = (undefined8 *)((long)puVar1 + 4);
    pfVar2 = pfVar2 + 1;
    puVar6 = (undefined8 *)((long)puVar6 + 4);
  } while (lVar4 != 4);
  local_a8 = local_98;
  local_a0 = (undefined4)uStack_90;
  local_b8 = CONCAT44(uStack_80,uStack_84);
  local_b0 = uStack_7c;
  local_e0[0] = 0.0;
  local_e0[1] = 0.0;
  local_d8 = local_d8 & 0xffffffff00000000;
  lVar4 = 0;
  do {
    local_e0[lVar4] =
         *(float *)((long)&local_a8 + lVar4 * 4) + *(float *)((long)&local_b8 + lVar4 * 4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_c8 = stack0xffffffffffffff90;
  local_c0 = res_1.m_data[0];
  afStack_f8[2] = 0.0;
  afStack_f8[3] = 0.0;
  afStack_f8[4] = 0.0;
  lVar4 = 0;
  do {
    afStack_f8[lVar4 + 2] = local_e0[lVar4] + *(float *)((long)&local_c8 + lVar4 * 4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_d8 = 0x100000000;
  local_d0 = 2;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[(int)local_e0[lVar4]] = afStack_f8[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(matrixCompMult(in0, in1));
	}